

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::OneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  LogMessage *other;
  LogFinisher local_51;
  string field_name;
  
  if ((((byte)this[1] & 0x10) == 0) || (*(long *)(this + 0x28) == 0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&field_name,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1c9);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&field_name,"CHECK failed: field->containing_oneof(): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage((LogMessage *)&field_name);
  }
  UnderscoresToCamelCase(&field_name,*(string **)(this + 8),true);
  std::operator+(__return_storage_ptr__,"k",&field_name);
  std::__cxx11::string::~string((string *)&field_name);
  return __return_storage_ptr__;
}

Assistant:

std::string OneofCaseConstantName(const FieldDescriptor* field) {
  GOOGLE_DCHECK(field->containing_oneof());
  std::string field_name = UnderscoresToCamelCase(field->name(), true);
  return "k" + field_name;
}